

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3aa4::OutputRedirectTest_FlushErrorInRestoreAndRead_Test::TestBody
          (OutputRedirectTest_FlushErrorInRestoreAndRead_Test *this)

{
  file __fd;
  bool bVar1;
  int __fd2;
  char *pcVar2;
  string_view message;
  AssertHelper local_a0;
  file write_end;
  file write_copy;
  AssertionResult gtest_ar_1;
  file read_end;
  buffered_file f;
  AssertionResult gtest_ar;
  OutputRedirect redir;
  string local_40;
  
  read_end.fd_ = -1;
  write_end.fd_ = -1;
  fmt::v5::file::pipe(&read_end,&write_end.fd_);
  __fd = write_end;
  fmt::v5::file::dup(&write_copy,write_end.fd_);
  fmt::v5::file::fdopen((file *)&f,(int)&write_end,"w");
  OutputRedirect::OutputRedirect(&redir,f.file_);
  local_a0.data_._0_1_ = 0x78;
  gtest_ar_1._0_4_ = fputc(0x78,(FILE *)f.file_);
  testing::internal::CmpHelperEQ<char,int>
            ((internal *)&gtest_ar,"\'x\'","fputc(\'x\', f.get())",(char *)&local_a0,
             (int *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
               ,0x180,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  close(__fd.fd_);
  testing::AssertionSuccess();
  if (gtest_ar_1.success_ == true) {
    message.size_ = 0x13;
    message.data_ = "cannot flush stream";
    format_system_error_abi_cxx11_((string *)&gtest_ar,9,message);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      OutputRedirect::restore_and_read_abi_cxx11_(&local_40,&redir);
      std::__cxx11::string::~string((string *)&local_40);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_1,
               (char (*) [111])
               "Expected: redir.restore_and_read() throws an exception of type fmt::system_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  if (gtest_ar_1.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
             ,0x183,pcVar2);
  testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  fmt::v5::file::dup2(&write_copy,__fd.fd_,__fd2);
  OutputRedirect::~OutputRedirect(&redir);
  fmt::v5::buffered_file::~buffered_file(&f);
  fmt::v5::file::~file(&write_copy);
  fmt::v5::file::~file(&write_end);
  fmt::v5::file::~file(&read_end);
  return;
}

Assistant:

TEST(OutputRedirectTest, FlushErrorInRestoreAndRead) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  int write_fd = write_end.descriptor();
  file write_copy = write_end.dup(write_fd);
  buffered_file f = write_end.fdopen("w");
  OutputRedirect redir(f.get());
  // Put a character in a file buffer.
  EXPECT_EQ('x', fputc('x', f.get()));
  FMT_POSIX(close(write_fd));
  EXPECT_SYSTEM_ERROR_NOASSERT(redir.restore_and_read(),
      EBADF, "cannot flush stream");
  write_copy.dup2(write_fd);  // "undo" close or dtor will fail
}